

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

bool __thiscall capnp::SchemaLoader::Validator::validate(Validator *this,Reader *node)

{
  uint uVar1;
  undefined2 uVar2;
  uint64_t scopeId;
  undefined1 uVar3;
  byte bVar4;
  ArrayPtr<const_char> AVar5;
  Fault f;
  ListElementCount LStack_d0;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_af;
  anon_class_16_2_3fe397bd _kjContextFunc224;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:224:5)>
  _kjContext224;
  
  this->isValid = true;
  if ((node->_reader).pointerCount == 0) {
    _kjContext224.super_Context.super_ExceptionCallback.next = (ExceptionCallback *)0x0;
    _kjContext224.super_Context._16_8_ = (WirePointer *)0x0;
    _kjContext224.super_Context.super_ExceptionCallback._vptr_ExceptionCallback = (_func_int **)0x0;
    _kjContext224.super_Context.value.ptr._0_4_ = 0x7fffffff;
  }
  else {
    _kjContext224.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
         (_func_int **)(node->_reader).segment;
    _kjContext224.super_Context.super_ExceptionCallback.next =
         (ExceptionCallback *)(node->_reader).capTable;
    _kjContext224.super_Context._16_8_ = (node->_reader).pointers;
    _kjContext224.super_Context.value.ptr._0_4_ = (node->_reader).nestingLimit;
  }
  AVar5 = (ArrayPtr<const_char>)
          _::PointerReader::getBlob<capnp::Text>((PointerReader *)&_kjContext224,(void *)0x0,0);
  (this->nodeName).super_StringPtr.content = AVar5;
  kj::_::BTreeImpl::clear(&(this->dependencies).table.indexes.impl);
  (this->dependencies).table.rows.builder.pos = (this->dependencies).table.rows.builder.ptr;
  _kjContextFunc224.this = this;
  _kjContextFunc224.node = node;
  kj::_::Debug::Context::Context(&_kjContext224.super_Context);
  _kjContext224.super_Context.super_ExceptionCallback._vptr_ExceptionCallback =
       (_func_int **)&PTR__Context_001c2d98;
  __kjCondition = (SegmentReader *)0x0;
  if (5 < (node->_reader).pointerCount) {
    __kjCondition = (node->_reader).segment;
  }
  _kjContext224.func = &_kjContextFunc224;
  _::PointerReader::getList
            ((ListReader *)&f,(PointerReader *)&_kjCondition,INLINE_COMPOSITE,(word *)0x0);
  if (LStack_d0 != 0) {
    if ((node->_reader).dataSize < 0x121) {
      bVar4 = 0;
    }
    else {
      bVar4 = *(byte *)((long)(node->_reader).data + 0x24) & 1;
    }
    __kjCondition = (SegmentReader *)CONCAT71(uStack_af,bVar4);
    if (bVar4 == 0) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[55]>
                (&f,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                 ,0xe3,FAILED,"node.getIsGeneric()",
                 "_kjCondition,\"if parameter list is non-empty, isGeneric must be true\"",
                 &_kjCondition,
                 (char (*) [55])"if parameter list is non-empty, isGeneric must be true");
      this->isValid = false;
      kj::_::Debug::Fault::~Fault(&f);
      uVar3 = 0;
      goto LAB_00141410;
    }
  }
  uVar1 = (node->_reader).dataSize;
  if (uVar1 < 0x70) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined2 *)((long)(node->_reader).data + 0xc);
  }
  switch(uVar2) {
  case 1:
    f.exception = (Exception *)(node->_reader).segment;
    if (uVar1 < 0xc0) {
      scopeId = 0;
    }
    else {
      scopeId = *(uint64_t *)((long)(node->_reader).data + 0x10);
    }
    validate(this,(Reader *)&f,scopeId);
    break;
  case 2:
    f.exception = (Exception *)(node->_reader).segment;
    validate(this,(Reader *)&f);
    break;
  case 3:
    f.exception = (Exception *)(node->_reader).segment;
    validate(this,(Reader *)&f);
    break;
  case 4:
    f.exception = (Exception *)(node->_reader).segment;
    validate(this,(Reader *)&f);
    break;
  case 5:
    if ((node->_reader).pointerCount < 4) {
      __kjCondition = (SegmentReader *)0x0;
    }
    else {
      __kjCondition = (node->_reader).segment;
    }
    _::PointerReader::getStruct((StructReader *)&f,(PointerReader *)&_kjCondition,(word *)0x0);
    validate(this,(Reader *)&f);
  }
  uVar3 = this->isValid;
LAB_00141410:
  kj::_::Debug::Context::~Context(&_kjContext224.super_Context);
  return (bool)uVar3;
}

Assistant:

bool validate(const schema::Node::Reader& node) {
    isValid = true;
    nodeName = node.getDisplayName();
    dependencies.clear();

    KJ_CONTEXT("validating schema node", nodeName, (uint)node.which());

    if (node.getParameters().size() > 0) {
      KJ_REQUIRE(node.getIsGeneric(), "if parameter list is non-empty, isGeneric must be true") {
        isValid = false;
        return false;
      }
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        validate(node.getStruct(), node.getScopeId());
        break;
      case schema::Node::ENUM:
        validate(node.getEnum());
        break;
      case schema::Node::INTERFACE:
        validate(node.getInterface());
        break;
      case schema::Node::CONST:
        validate(node.getConst());
        break;
      case schema::Node::ANNOTATION:
        validate(node.getAnnotation());
        break;
    }

    // We accept and pass through node types we don't recognize.
    return isValid;
  }